

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.cxx
# Opt level: O0

bool __thiscall cmCTestRunTest::NeedsToRepeat(cmCTestRunTest *this)

{
  cmCTestRunTest *this_local;
  
  this->NumberOfRunsLeft = this->NumberOfRunsLeft + -1;
  if (this->NumberOfRunsLeft == 0) {
    this_local._7_1_ = false;
  }
  else if ((this->TestResult).Status == 0) {
    this_local._7_1_ = false;
  }
  else if ((((this->RepeatMode == UntilFail) && ((this->TestResult).Status == 9)) ||
           ((this->RepeatMode == UntilPass && ((this->TestResult).Status != 9)))) ||
          ((this->RepeatMode == AfterTimeout && ((this->TestResult).Status == 1)))) {
    this->RunAgain = true;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestRunTest::NeedsToRepeat()
{
  this->NumberOfRunsLeft--;
  if (this->NumberOfRunsLeft == 0) {
    return false;
  }
  // If a test is marked as NOT_RUN it will not be repeated
  // no matter the repeat settings, so just record it as-is.
  if (this->TestResult.Status == cmCTestTestHandler::NOT_RUN) {
    return false;
  }
  // if number of runs left is not 0, and we are running until
  // we find a failed (or passed) test, then return true so the test can be
  // restarted
  if ((this->RepeatMode == cmCTest::Repeat::UntilFail &&
       this->TestResult.Status == cmCTestTestHandler::COMPLETED) ||
      (this->RepeatMode == cmCTest::Repeat::UntilPass &&
       this->TestResult.Status != cmCTestTestHandler::COMPLETED) ||
      (this->RepeatMode == cmCTest::Repeat::AfterTimeout &&
       this->TestResult.Status == cmCTestTestHandler::TIMEOUT)) {
    this->RunAgain = true;
    return true;
  }
  return false;
}